

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FilteredStorage.hpp
# Opt level: O2

void __thiscall
supermap::
FilteredStorage<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_supermap::Key<3UL>,_supermap::FilteringRegister<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_supermap::Key<3UL>_>,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>_>
::FilteredStorage(FilteredStorage<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_supermap::Key<3UL>,_supermap::FilteringRegister<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_supermap::Key<3UL>_>,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>_>
                  *this,SortedStorage *sortedStorage)

{
  SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>,_supermap::Key<3UL>_>
  ::SortedSingleFileIndexedStorage
            (&this->
              super_SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>,_supermap::Key<3UL>_>
             ,sortedStorage);
  (this->
  super_SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>,_supermap::Key<3UL>_>
  ).
  super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>_>
  .
  super_IndexedStorage<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>_>
  .
  super_OrderedStorage<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>_>
  ._vptr_OrderedStorage = (_func_int **)&PTR_append_001f7c30;
  (this->
  super_SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>,_supermap::Key<3UL>_>
  ).super_Findable<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_supermap::Key<3UL>_>.
  _vptr_Findable = (_func_int **)&DAT_001f7c78;
  return;
}

Assistant:

explicit FilteredStorage(SortedStorage &&sortedStorage)
        : SortedSingleFileIndexedStorage<Content, IndexT, RegisterInfo, FindPattern>(std::move(sortedStorage)) {}